

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O3

ze_result_t loader::zeEventPoolDestroy(ze_event_pool_handle_t hEventPool)

{
  _ze_event_pool_handle_t *_key;
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hEventPool + 8) + 0x460) == (code *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_event_pool_handle_t **)hEventPool;
    zVar1 = (**(code **)(*(long *)(hEventPool + 8) + 0x460))(_key);
    if (zVar1 == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_event_pool_handle_t_*>,__ze_event_pool_handle_t_*>::release
                ((singleton_factory_t<object_t<_ze_event_pool_handle_t_*>,__ze_event_pool_handle_t_*>
                  *)(context + 0x240),_key);
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolDestroy(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_event_pool_object_t*>( hEventPool )->dditable;
        auto pfnDestroy = dditable->ze.EventPool.pfnDestroy;
        if( nullptr == pfnDestroy )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hEventPool = reinterpret_cast<ze_event_pool_object_t*>( hEventPool )->handle;

        // forward to device-driver
        result = pfnDestroy( hEventPool );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_event_pool_factory.release( hEventPool );

        return result;
    }